

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

string * __thiscall
cfd::api::json::ElementsDecodeIssuance::GetTokenString_abi_cxx11_
          (string *__return_storage_ptr__,ElementsDecodeIssuance *this,ElementsDecodeIssuance *obj)

{
  core::ConvertToString<std::__cxx11::string>
            (__return_storage_ptr__,(core *)&this->token_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)obj);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetTokenString(  // line separate
      const ElementsDecodeIssuance& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.token_);
  }